

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.h
# Opt level: O3

bool __thiscall JSONNode::empty(JSONNode *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  internalJSONNode *piVar2;
  jsonChildren *pjVar3;
  bool bVar4;
  size_type __dnew;
  size_type local_40;
  json_string local_38;
  
  piVar2 = this->internal;
  paVar1 = &local_38.field_2;
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"no internal","");
  JSONDebug::_JSON_ASSERT(piVar2 != (internalJSONNode *)0x0,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  piVar2 = this->internal;
  bVar4 = true;
  if (0xfd < (byte)(piVar2->_type - 6)) {
    internalJSONNode::Fetch(piVar2);
    pjVar3 = piVar2->Children;
    local_40 = 0x16;
    local_38._M_dataplus._M_p = (pointer)paVar1;
    local_38._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_38,(ulong)&local_40);
    local_38.field_2._M_allocated_capacity = local_40;
    builtin_strncpy(local_38._M_dataplus._M_p,"Children is null empty",0x16);
    local_38._M_string_length = local_40;
    local_38._M_dataplus._M_p[local_40] = '\0';
    JSONDebug::_JSON_ASSERT(true,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != paVar1) {
      operator_delete(local_38._M_dataplus._M_p);
    }
    bVar4 = pjVar3->mysize == 0;
  }
  return bVar4;
}

Assistant:

inline bool JSONNode::empty(void) const json_nothrow {
    JSON_CHECK_INTERNAL();
    return internal -> empty();
}